

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlXPathObjectPtr xmlXPathCacheNewString(xmlXPathParserContextPtr pctxt,xmlChar *val)

{
  void *pvVar1;
  xmlChar *pxVar2;
  xmlXPathObjectPtr pxVar3;
  xmlXPathContextCachePtr cache;
  
  if (((pctxt->context == (xmlXPathContextPtr)0x0) ||
      (pvVar1 = pctxt->context->cache, pvVar1 == (void *)0x0)) || (*(long *)((long)pvVar1 + 8) == 0)
     ) {
    pxVar3 = xmlXPathNewString(val);
    if (pxVar3 != (xmlXPathObjectPtr)0x0) {
      return pxVar3;
    }
  }
  else {
    pxVar2 = "";
    if (val != (xmlChar *)0x0) {
      pxVar2 = val;
    }
    pxVar2 = xmlStrdup(pxVar2);
    if (pxVar2 != (xmlChar *)0x0) {
      pxVar3 = *(xmlXPathObjectPtr *)((long)pvVar1 + 8);
      *(xmlChar **)((long)pvVar1 + 8) = pxVar3->stringval;
      *(int *)((long)pvVar1 + 0x18) = *(int *)((long)pvVar1 + 0x18) + -1;
      pxVar3->type = XPATH_STRING;
      pxVar3->stringval = pxVar2;
      return pxVar3;
    }
  }
  xmlXPathPErrMemory(pctxt);
  return (xmlXPathObjectPtr)0x0;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheNewString(xmlXPathParserContextPtr pctxt, const xmlChar *val)
{
    xmlXPathObjectPtr ret;
    xmlXPathContextPtr ctxt = pctxt->context;

    if ((ctxt != NULL) && (ctxt->cache != NULL)) {
	xmlXPathContextCachePtr cache = (xmlXPathContextCachePtr) ctxt->cache;

	if (cache->miscObjs != NULL) {
            xmlChar *copy;

            if (val == NULL)
                val = BAD_CAST "";
            copy = xmlStrdup(val);
            if (copy == NULL) {
                xmlXPathPErrMemory(pctxt);
                return(NULL);
            }

	    ret = cache->miscObjs;
            cache->miscObjs = (void *) ret->stringval;
            cache->numMisc -= 1;
	    ret->type = XPATH_STRING;
            ret->stringval = copy;
	    return(ret);
	}
    }

    ret = xmlXPathNewString(val);
    if (ret == NULL)
        xmlXPathPErrMemory(pctxt);
    return(ret);
}